

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * conditional(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Token **parser_00;
  _Bool _Var1;
  C_Parser *node_00;
  C_Obj *var_00;
  C_Node *rhs_00;
  C_Node *pCVar2;
  C_Parser *pCVar3;
  C_Node *pCVar4;
  C_Node *node;
  C_Node *rhs;
  C_Node *lhs;
  C_Obj *var;
  C_Node *cond;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  cond = (C_Node *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  node_00 = (C_Parser *)logor(parser,(C_Token **)&cond,tok);
  _Var1 = C_equal((C_Token *)cond,"?");
  if (_Var1) {
    _Var1 = C_equal((C_Token *)cond->next,":");
    if (_Var1) {
      C_add_type((C_Parser *)rest_local,(C_Node *)node_00);
      var_00 = new_lvar((C_Parser *)rest_local,"",(C_Type *)node_00->input_files);
      parser_00 = rest_local;
      pCVar4 = new_var_node((C_Parser *)rest_local,var_00,(C_Token *)cond);
      pCVar4 = new_binary((C_Parser *)parser_00,ND_ASSIGN,pCVar4,(C_Node *)node_00,(C_Token *)cond);
      rhs_00 = new_node((C_Parser *)rest_local,ND_COND,(C_Token *)cond);
      pCVar2 = new_var_node((C_Parser *)rest_local,var_00,(C_Token *)cond);
      rhs_00->cond = pCVar2;
      pCVar2 = new_var_node((C_Parser *)rest_local,var_00,(C_Token *)cond);
      rhs_00->then = pCVar2;
      pCVar2 = conditional((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)cond->next->next)
      ;
      rhs_00->els = pCVar2;
      parser_local = (C_Parser *)
                     new_binary((C_Parser *)rest_local,ND_COMMA,pCVar4,rhs_00,(C_Token *)cond);
    }
    else {
      pCVar3 = (C_Parser *)new_node((C_Parser *)rest_local,ND_COND,(C_Token *)cond);
      pCVar3->scope = (C_Scope *)node_00;
      pCVar4 = expr((C_Parser *)rest_local,(C_Token **)&cond,(C_Token *)cond->next);
      pCVar3->current_fn = (C_Obj *)pCVar4;
      cond = (C_Node *)C_skip((C_Parser *)rest_local,(C_Token *)cond,":");
      pCVar4 = conditional((C_Parser *)rest_local,(C_Token **)tok_local,(C_Token *)cond);
      pCVar3->gotos = pCVar4;
      parser_local = pCVar3;
    }
  }
  else {
    *(C_Node **)tok_local = cond;
    parser_local = node_00;
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *conditional(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *cond = logor(parser, &tok, tok);

  if (!C_equal(tok, "?")) {
    *rest = tok;
    return cond;
  }

  if (C_equal(tok->next, ":")) {
    // [GNU] Compile `a ?: b` as `tmp = a, tmp ? tmp : b`.
    C_add_type(parser, cond);
    C_Obj *var = new_lvar(parser, "", cond->ty);
    C_Node *lhs = new_binary(parser, ND_ASSIGN, new_var_node(parser, var, tok), cond, tok);
    C_Node *rhs = new_node(parser, ND_COND, tok);
    rhs->cond = new_var_node(parser, var, tok);
    rhs->then = new_var_node(parser, var, tok);
    rhs->els = conditional(parser, rest, tok->next->next);
    return new_binary(parser, ND_COMMA, lhs, rhs, tok);
  }

  C_Node *node = new_node(parser, ND_COND, tok);
  node->cond = cond;
  node->then = expr(parser, &tok, tok->next);
  tok = C_skip(parser, tok, ":");
  node->els = conditional(parser, rest, tok);
  return node;
}